

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool __thiscall
interpreter::Interpreter::checkEvalErrors
          (Interpreter *this,
          list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *eval_src)

{
  int iVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  GCPtr<symbols::Object> eval;
  GCPtr<symbols::ErrorObject> err;
  GCPtr<symbols::Object> local_60;
  GCPtr<symbols::ErrorObject> local_58;
  string local_50 [32];
  
  bVar4 = false;
  p_Var3 = (_List_node_base *)eval_src;
  while (p_Var3 = (((_List_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *)
                   &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)eval_src) {
    GCPtr<symbols::Object>::GCPtr(&local_60,(GCPtr<symbols::Object> *)(p_Var3 + 1));
    iVar1 = (**((Object *)&(local_60.addr)->_vptr_Object)->_vptr_Object)();
    if (iVar1 == 4) {
      GCPtr<symbols::ErrorObject>::GCPtr(&local_58,(ErrorObject *)local_60.addr);
      (*((local_58.addr)->super_Object)._vptr_Object[3])(local_50);
      poVar2 = std::operator<<((ostream *)&std::cout,local_50);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_50);
      GCPtr<symbols::ErrorObject>::~GCPtr(&local_58);
      bVar4 = true;
    }
    GCPtr<symbols::Object>::~GCPtr(&local_60);
  }
  return bVar4;
}

Assistant:

bool  interpreter::Interpreter::checkEvalErrors(list<GCPtr<Object>> eval_src)
{
    bool hasErrors = false;
    for(auto eval : eval_src){
        if(eval->type() == Types::ERRORTYPE){
            GCPtr<ErrorObject> err = static_cast<ErrorObject*>(eval.raw());
            cout << err->toString() << endl;
            hasErrors = true;
        }
    }
    return hasErrors;
}